

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O0

int glfwGetOSMesaColorBuffer(GLFWwindow *handle,int *width,int *height,int *format,void **buffer)

{
  int iVar1;
  _GLFWwindow *window;
  int local_48;
  GLint mesaFormat;
  GLint mesaHeight;
  GLint mesaWidth;
  void *mesaBuffer;
  void **buffer_local;
  int *format_local;
  int *height_local;
  int *width_local;
  GLFWwindow *handle_local;
  
  mesaBuffer = buffer;
  buffer_local = (void **)format;
  format_local = height;
  height_local = width;
  width_local = (int *)handle;
  if (handle != (GLFWwindow *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      handle_local._4_4_ = 0;
    }
    else {
      iVar1 = (*_glfw.osmesa.GetColorBuffer)
                        (*(OSMesaContext *)(handle + 0x298),&mesaFormat,&local_48,
                         (int *)((long)&window + 4),(void **)&mesaHeight);
      if (iVar1 == 0) {
        _glfwInputError(0x10008,"OSMesa: Failed to retrieve color buffer");
        handle_local._4_4_ = 0;
      }
      else {
        if (height_local != (int *)0x0) {
          *height_local = mesaFormat;
        }
        if (format_local != (int *)0x0) {
          *format_local = local_48;
        }
        if (buffer_local != (void **)0x0) {
          *(undefined4 *)buffer_local = window._4_4_;
        }
        if (mesaBuffer != (void *)0x0) {
          *(void **)mesaBuffer = _mesaHeight;
        }
        handle_local._4_4_ = 1;
      }
    }
    return handle_local._4_4_;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/glfw/src/osmesa_context.c"
                ,299,"int glfwGetOSMesaColorBuffer(GLFWwindow *, int *, int *, int *, void **)");
}

Assistant:

GLFWAPI int glfwGetOSMesaColorBuffer(GLFWwindow* handle, int* width,
                                     int* height, int* format, void** buffer)
{
    void* mesaBuffer;
    GLint mesaWidth, mesaHeight, mesaFormat;
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (!OSMesaGetColorBuffer(window->context.osmesa.handle,
                              &mesaWidth, &mesaHeight,
                              &mesaFormat, &mesaBuffer))
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "OSMesa: Failed to retrieve color buffer");
        return GLFW_FALSE;
    }

    if (width)
        *width = mesaWidth;
    if (height)
        *height = mesaHeight;
    if (format)
        *format = mesaFormat;
    if (buffer)
        *buffer = mesaBuffer;

    return GLFW_TRUE;
}